

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

int __thiscall QProcessEnvironment::remove(QProcessEnvironment *this,char *__filename)

{
  QProcessEnvironmentPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).d.ptr != (QProcessEnvironmentPrivate *)0x0) {
    this_00 = QSharedDataPointer<QProcessEnvironmentPrivate>::data(&this->d);
    QProcessEnvironmentPrivate::prepareName((Key *)&QStack_38,this_00,(QString *)__filename);
    QMap<QByteArray,_QProcEnvValue>::remove(&this_00->vars,(char *)&QStack_38);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QProcessEnvironment::remove(const QString &name)
{
    if (d.constData()) {
        QProcessEnvironmentPrivate *p = d.data();
        p->vars.remove(p->prepareName(name));
    }
}